

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O2

VertexHandle __thiscall
OpenMesh::IO::ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_>::add_vertex
          (ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this,Vec3f *_point)

{
  BaseHandle BVar1;
  undefined1 local_20 [8];
  VectorT<double,_3> dst;
  
  local_20 = (undefined1  [8])(double)(_point->super_VectorDataT<float,_3>).values_[0];
  dst.super_VectorDataT<double,_3>.values_[0] =
       (double)(_point->super_VectorDataT<float,_3>).values_[1];
  dst.super_VectorDataT<double,_3>.values_[1] =
       (double)(_point->super_VectorDataT<float,_3>).values_[2];
  BVar1.idx_ = (int)PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                    ::new_vertex((PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                  *)this->mesh_,(Point *)local_20);
  return (BaseHandle)(BaseHandle)BVar1.idx_;
}

Assistant:

virtual VertexHandle add_vertex(const Vec3f& _point)
  {
    return mesh_.add_vertex(vector_cast<Point>(_point));
  }